

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.h
# Opt level: O1

QDBusSignature * qvariant_cast<QDBusSignature>(QDBusSignature *__return_storage_ptr__,QVariant *v)

{
  PrivateShared *pPVar1;
  bool bVar2;
  QMetaType QVar3;
  long in_FS_OFFSET;
  QMetaType local_28;
  QMetaType local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QDBusSignature>::metaType;
  local_28.d_ptr = (QMetaTypeInterface *)(*(ulong *)&(v->d).field_0x18 & 0xfffffffffffffffc);
  bVar2 = comparesEqual(&local_28,&local_20);
  if (bVar2) {
    if (((v->d).field_0x18 & 1) != 0) {
      pPVar1 = (v->d).data.shared;
      v = (QVariant *)(pPVar1 + *(int *)(pPVar1 + 4));
    }
    pPVar1 = (((Private *)&((PrivateShared *)v)->field_0x0)->data).shared;
    (__return_storage_ptr__->m_signature).d.d = (Data *)pPVar1;
    (__return_storage_ptr__->m_signature).d.ptr =
         *(char16_t **)&((PrivateShared *)((long)v + 8))->field_0x0;
    (__return_storage_ptr__->m_signature).d.size =
         *(qsizetype *)&((PrivateShared *)((long)v + 0x10))->field_0x0;
    if (pPVar1 != (PrivateShared *)0x0) {
      LOCK();
      *(int *)pPVar1 = *(int *)pPVar1 + 1;
      UNLOCK();
    }
  }
  else {
    (__return_storage_ptr__->m_signature).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->m_signature).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->m_signature).d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QDBusSignature::QDBusSignature(__return_storage_ptr__);
    QVar3.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
    if (((v->d).field_0x18 & 1) != 0) {
      pPVar1 = (v->d).data.shared;
      v = (QVariant *)(pPVar1 + *(int *)(pPVar1 + 4));
    }
    QMetaType::convert(QVar3,v,local_20,__return_storage_ptr__);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

inline T qvariant_cast(const QVariant &v)
{
    QMetaType targetType = QMetaType::fromType<T>();
    if (v.d.type() == targetType)
        return v.d.get<T>();
    if constexpr (std::is_same_v<T,std::remove_const_t<std::remove_pointer_t<T>> const *>) {
        using nonConstT = std::remove_const_t<std::remove_pointer_t<T>> *;
        QMetaType nonConstTargetType = QMetaType::fromType<nonConstT>();
        if (v.d.type() == nonConstTargetType)
            return v.d.get<nonConstT>();
    }

    T t{};
    QMetaType::convert(v.metaType(), v.constData(), targetType, &t);
    return t;
}